

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP5Reader::PerformGets(BP5Reader *this)

{
  ArrayOrdering AVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  EVPathRemote *this_00;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  Remote *pRVar9;
  string RemoteName;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  if ((this->m_dataIsRemote == true) &&
     ((this->m_Remote)._M_t.
      super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
      super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
      super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl == (Remote *)0x0)) {
    if ((this->m_BP5Deserializer->PendingGetRequests).
        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->m_BP5Deserializer->PendingGetRequests).
        super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    AVar1 = ((this->super_Engine).m_IO)->m_ArrayOrder;
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    if ((((this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length != 0) ||
        (pcVar5 = getenv("DoRemote"), pcVar5 != (char *)0x0)) ||
       (pcVar5 = getenv("DoXRootD"), pcVar5 != (char *)0x0)) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    this_00 = (EVPathRemote *)operator_new(0x140);
    EVPathRemote::EVPathRemote(this_00,(this->super_Engine).m_HostOptions);
    pRVar9 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    (this->m_Remote)._M_t.
    super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
    super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
    super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl = (Remote *)this_00;
    if (pRVar9 != (Remote *)0x0) {
      (*pRVar9->_vptr_Remote[1])();
      this_00 = (EVPathRemote *)
                (this->m_Remote)._M_t.
                super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
                super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
                super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    }
    pcVar2 = (this->super_BP5Engine).m_Parameters.RemoteHost._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,
               pcVar2 + (this->super_BP5Engine).m_Parameters.RemoteHost._M_string_length);
    uVar3 = Remote::LaunchRemoteServerViaConnectionManager(&this_00->super_Remote,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pRVar9 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"localhost","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)local_90,local_b0,local_b0 + local_a8);
    (*pRVar9->_vptr_Remote[3])
              (pRVar9,local_70,(ulong)uVar3,local_90,(ulong)(this->super_Engine).m_OpenMode,
               (ulong)(AVar1 == RowMajor));
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    pRVar9 = (this->m_Remote)._M_t.
             super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
             super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
             super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    if (pRVar9 == (Remote *)0x0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Engine","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BP5Reader","");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"OpenFiles","");
      std::operator+(&local_d0,"Remote file ",&(this->super_Engine).m_Name);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_150.field_2._M_allocated_capacity = *psVar8;
        local_150.field_2._8_8_ = plVar6[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar8;
        local_150._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_150._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_f0,&local_110,&local_130,&local_150,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      pRVar9 = (this->m_Remote)._M_t.
               super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
               super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
               super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
    }
    iVar4 = (*pRVar9->_vptr_Remote[2])();
    if ((char)iVar4 == '\0') {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Engine","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BP5Reader","");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"OpenFiles","");
      std::operator+(&local_d0,"Remote file ",&(this->super_Engine).m_Name);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_150.field_2._M_allocated_capacity = *psVar8;
        local_150.field_2._8_8_ = puVar7[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar8;
        local_150._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_150._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_f0,&local_110,&local_130,&local_150,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
  }
  if ((this->m_Remote)._M_t.
      super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
      super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
      super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl == (Remote *)0x0) {
    PerformLocalGets(this);
  }
  else {
    PerformRemoteGets(this);
  }
  adios2::format::BP5Deserializer::ClearGetState(this->m_BP5Deserializer);
  return;
}

Assistant:

void BP5Reader::PerformGets()
{
    // if dataIsRemote is true and m_Remote is not true, this is our first time through
    // PerformGets() Either we don't need a remote open (m_dataIsRemote=false), or we need to Open
    // remote file (or die trying)
    if (m_dataIsRemote && !m_Remote)
    {
        bool RowMajorOrdering = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);

        // If nothing is pending, don't open
        if (m_BP5Deserializer->PendingGetRequests.size() == 0)
            return;

        std::string RemoteName;
        if (!m_Parameters.RemoteDataPath.empty())
        {
            RemoteName = m_Parameters.RemoteDataPath;
        }
        else if (getenv("DoRemote") || getenv("DoXRootD"))
        {
            RemoteName = m_Name;
        }
        (void)RowMajorOrdering; // Use in case no remotes available
#ifdef ADIOS2_HAVE_XROOTD
        if (getenv("DoXRootD"))
        {
            m_Remote = std::unique_ptr<XrootdRemote>(new XrootdRemote(m_HostOptions));
            m_Remote->Open("localhost", 1094, m_Name, m_OpenMode, RowMajorOrdering);
        }
        else
#endif
#ifdef ADIOS2_HAVE_SST
        {
            m_Remote = std::unique_ptr<EVPathRemote>(new EVPathRemote(m_HostOptions));
            int localPort =
                m_Remote->LaunchRemoteServerViaConnectionManager(m_Parameters.RemoteHost);
            m_Remote->Open("localhost", localPort, RemoteName, m_OpenMode, RowMajorOrdering);
        }
#endif
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            m_KVCache.OpenConnection();
            m_Fingerprint = m_Parameters.UUID;
            if (m_Fingerprint.empty())
            {
                m_KVCache.RemotePathHashMd5(RemoteName, m_Fingerprint);
            }
            m_KVCache.SetLocalCacheFile(m_Name + PathSeparator + "data");
        }
#endif
        if (m_Remote == nullptr)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
        if (!(*m_Remote)) // evaluate validity of object, not just that the pointer is non-NULL
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP5Reader", "OpenFiles",
                "Remote file " + m_Name +
                    " cannot be opened. Possible server or file specification error.");
        }
    }

    if (m_Remote)
    {
#ifdef ADIOS2_HAVE_KVCACHE
        if (getenv("useKVCache"))
        {
            PerformRemoteGetsWithKVCache();
        }
        else
        {
            PerformRemoteGets();
        }
#else
        PerformRemoteGets();
#endif
    }
    else
    {
        PerformLocalGets();
    }

    // clear pending requests inside deserializer
    m_BP5Deserializer->ClearGetState();
}